

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFE.cpp
# Opt level: O0

void __thiscall Storage::Disk::HFE::HFE(HFE *this,string *file_name)

{
  bool bVar1;
  uint8_t uVar2;
  byte bVar3;
  uint16_t uVar4;
  undefined4 *puVar5;
  string *file_name_local;
  HFE *this_local;
  
  DiskImage::DiskImage(&this->super_DiskImage);
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__HFE_00caa308;
  FileHolder::FileHolder(&this->file_,file_name,ReadWrite);
  bVar1 = FileHolder::check_signature(&this->file_,"HXCPICFE",0);
  if (!bVar1) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0xfffffffe;
    __cxa_throw(puVar5,&Error::typeinfo,0);
  }
  uVar2 = FileHolder::get8(&this->file_);
  if (uVar2 != '\0') {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0xfffffffd;
    __cxa_throw(puVar5,&Error::typeinfo,0);
  }
  bVar3 = FileHolder::get8(&this->file_);
  this->track_count_ = (uint)bVar3;
  bVar3 = FileHolder::get8(&this->file_);
  this->head_count_ = (uint)bVar3;
  FileHolder::seek(&this->file_,7,1);
  uVar4 = FileHolder::get16le(&this->file_);
  this->track_list_offset_ = (ulong)uVar4 << 9;
  return;
}

Assistant:

HFE::HFE(const std::string &file_name) :
		file_(file_name) {
	if(!file_.check_signature("HXCPICFE")) throw Error::InvalidFormat;

	if(file_.get8()) throw Error::UnknownVersion;
	track_count_ = file_.get8();
	head_count_ = file_.get8();

	file_.seek(7, SEEK_CUR);
	track_list_offset_ = long(file_.get16le()) << 9;
}